

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5HighlightCb(void *pContext,int tflags,char *pToken,int nToken,int iStartOff,int iEndOff)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long in_FS_OFFSET;
  int rc;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0;
  if ((tflags & 1U) != 0) goto LAB_001f1668;
  iVar1 = *(int *)((long)pContext + 0x50);
  *(int *)((long)pContext + 0x50) = iVar1 + 1;
  if (-1 < *(int *)((long)pContext + 4)) {
    iVar2 = *pContext;
    if (*(int *)((long)pContext + 4) < iVar1 || iVar1 < iVar2) goto LAB_001f1668;
    if (iVar1 == iVar2 && iVar2 != 0) {
      *(int *)((long)pContext + 0x54) = iStartOff;
    }
  }
  bVar3 = true;
  if (*(int *)((long)pContext + 0x58) != 0) {
    if ((*(int *)((long)pContext + 0x44) < iVar1 && -1 < *(int *)((long)pContext + 0x44)) ||
       (iStartOff <= *(int *)((long)pContext + 0x54))) {
      bVar3 = false;
    }
    else {
      fts5HighlightAppend(&local_34,(HighlightContext *)pContext,*(char **)((long)pContext + 0x10),
                          -1);
      *(undefined4 *)((long)pContext + 0x58) = 0;
    }
  }
  if ((bool)(iVar1 == *(int *)((long)pContext + 0x44) & bVar3)) {
    fts5HighlightAppend(&local_34,(HighlightContext *)pContext,
                        (char *)((long)*(int *)((long)pContext + 0x54) +
                                *(long *)((long)pContext + 0x18)),
                        iStartOff - *(int *)((long)pContext + 0x54));
    fts5HighlightAppend(&local_34,(HighlightContext *)pContext,*(char **)((long)pContext + 8),-1);
    *(int *)((long)pContext + 0x54) = iStartOff;
    *(undefined4 *)((long)pContext + 0x58) = 1;
    if (iVar1 == *(int *)((long)pContext + 0x48)) {
LAB_001f15b9:
      fts5HighlightAppend(&local_34,(HighlightContext *)pContext,
                          (char *)((long)*(int *)((long)pContext + 0x54) +
                                  *(long *)((long)pContext + 0x18)),
                          iEndOff - *(int *)((long)pContext + 0x54));
      *(int *)((long)pContext + 0x54) = iEndOff;
      if (local_34 == 0) {
        local_34 = fts5CInstIterNext((CInstIter *)((long)pContext + 0x28));
      }
    }
  }
  else if (iVar1 == *(int *)((long)pContext + 0x48)) {
    if (bVar3) {
      fts5HighlightAppend(&local_34,(HighlightContext *)pContext,*(char **)((long)pContext + 8),-1);
      *(undefined4 *)((long)pContext + 0x58) = 1;
    }
    goto LAB_001f15b9;
  }
  if (iVar1 == *(int *)((long)pContext + 4)) {
    if (*(int *)((long)pContext + 0x58) != 0) {
      if (*(int *)((long)pContext + 0x44) <= iVar1 && -1 < *(int *)((long)pContext + 0x44)) {
        fts5HighlightAppend(&local_34,(HighlightContext *)pContext,
                            (char *)((long)*(int *)((long)pContext + 0x54) +
                                    *(long *)((long)pContext + 0x18)),
                            iEndOff - *(int *)((long)pContext + 0x54));
        *(int *)((long)pContext + 0x54) = iEndOff;
      }
      fts5HighlightAppend(&local_34,(HighlightContext *)pContext,*(char **)((long)pContext + 0x10),
                          -1);
      *(undefined4 *)((long)pContext + 0x58) = 0;
    }
    fts5HighlightAppend(&local_34,(HighlightContext *)pContext,
                        (char *)((long)*(int *)((long)pContext + 0x54) +
                                *(long *)((long)pContext + 0x18)),
                        iEndOff - *(int *)((long)pContext + 0x54));
    *(int *)((long)pContext + 0x54) = iEndOff;
  }
LAB_001f1668:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return local_34;
}

Assistant:

static int fts5HighlightCb(
  void *pContext,                 /* Pointer to HighlightContext object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iStartOff,                  /* Start byte offset of token */
  int iEndOff                     /* End byte offset of token */
){
  HighlightContext *p = (HighlightContext*)pContext;
  int rc = SQLITE_OK;
  int iPos;

  UNUSED_PARAM2(pToken, nToken);

  if( tflags & FTS5_TOKEN_COLOCATED ) return SQLITE_OK;
  iPos = p->iPos++;

  if( p->iRangeEnd>=0 ){
    if( iPos<p->iRangeStart || iPos>p->iRangeEnd ) return SQLITE_OK;
    if( p->iRangeStart && iPos==p->iRangeStart ) p->iOff = iStartOff;
  }

  /* If the parenthesis is open, and this token is not part of the current
  ** phrase, and the starting byte offset of this token is past the point
  ** that has currently been copied into the output buffer, close the
  ** parenthesis. */
  if( p->bOpen
   && (iPos<=p->iter.iStart || p->iter.iStart<0)
   && iStartOff>p->iOff
  ){
    fts5HighlightAppend(&rc, p, p->zClose, -1);
    p->bOpen = 0;
  }

  /* If this is the start of a new phrase, and the highlight is not open:
  **
  **   * copy text from the input up to the start of the phrase, and
  **   * open the highlight.
  */
  if( iPos==p->iter.iStart && p->bOpen==0 ){
    fts5HighlightAppend(&rc, p, &p->zIn[p->iOff], iStartOff - p->iOff);
    fts5HighlightAppend(&rc, p, p->zOpen, -1);
    p->iOff = iStartOff;
    p->bOpen = 1;
  }

  if( iPos==p->iter.iEnd ){
    if( p->bOpen==0 ){
      assert( p->iRangeEnd>=0 );
      fts5HighlightAppend(&rc, p, p->zOpen, -1);
      p->bOpen = 1;
    }
    fts5HighlightAppend(&rc, p, &p->zIn[p->iOff], iEndOff - p->iOff);
    p->iOff = iEndOff;

    if( rc==SQLITE_OK ){
      rc = fts5CInstIterNext(&p->iter);
    }
  }

  if( iPos==p->iRangeEnd ){
    if( p->bOpen ){
      if( p->iter.iStart>=0 && iPos>=p->iter.iStart ){
        fts5HighlightAppend(&rc, p, &p->zIn[p->iOff], iEndOff - p->iOff);
        p->iOff = iEndOff;
      }
      fts5HighlightAppend(&rc, p, p->zClose, -1);
      p->bOpen = 0;
    }
    fts5HighlightAppend(&rc, p, &p->zIn[p->iOff], iEndOff - p->iOff);
    p->iOff = iEndOff;
  }

  return rc;
}